

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cpp
# Opt level: O2

void __thiscall testing::internal::edit_distance::anon_unknown_1::Hunk::~Hunk(Hunk *this)

{
  std::__cxx11::
  _List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>::
  _M_clear(&(this->hunk_removes_).
            super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
          );
  std::__cxx11::
  _List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>::
  _M_clear(&(this->hunk_adds_).
            super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
          );
  std::__cxx11::
  _List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>::
  _M_clear(&(this->hunk_).
            super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
          );
  return;
}

Assistant:

Hunk(size_t left_start, size_t right_start)
      : left_start_(left_start),
        right_start_(right_start),
        adds_(),
        removes_(),
        common_() {}